

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofR.cpp
# Opt level: O1

void __thiscall OpenMD::GofR::preProcess(GofR *this)

{
  pointer pdVar1;
  pointer pdVar2;
  
  pdVar1 = (this->avgGofr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->avgGofr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
  }
  pdVar1 = (this->sumGofr1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->sumGofr1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
  }
  pdVar1 = (this->sumGofr2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->sumGofr2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
    return;
  }
  return;
}

Assistant:

void GofR::preProcess() {
    std::fill(avgGofr_.begin(), avgGofr_.end(), 0.0);
    std::fill(sumGofr1_.begin(), sumGofr1_.end(), 0.0);
    std::fill(sumGofr2_.begin(), sumGofr2_.end(), 0.0);
  }